

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolortransform.cpp
# Opt level: O3

void __thiscall
QColorTransformPrivate::applyConvertIn<unsigned_char>
          (QColorTransformPrivate *this,uchar *src,QColorVector *buffer,qsizetype len,
          TransformFlags flags)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  QColorSpacePrivate *pQVar11;
  element_type *peVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  undefined1 auVar25 [16];
  bool bVar26;
  long lVar27;
  _Array_type *__vtable;
  long lVar28;
  float *pfVar29;
  variant<QColorSpacePrivate::TransferElement,_QColorMatrix,_QColorVector,_QColorCLUT> *pvVar30;
  long in_FS_OFFSET;
  float fVar31;
  float fVar32;
  float fVar33;
  undefined1 auVar34 [16];
  QColorVector QVar35;
  anon_class_16_2_4b7f43a0 local_50;
  QColorVector *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_40 = buffer;
  bVar26 = QColorSpacePrivate::isThreeComponentMatrix((this->colorSpaceIn).d.ptr);
  if (bVar26) {
    pQVar11 = (this->colorSpaceIn).d.ptr;
    if ((pQVar11->colorModel == Gray) ||
       ((peVar12 = (pQVar11->lut).table[0].
                   super___shared_ptr<QColorTrcLut,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
        peVar12 ==
        (pQVar11->lut).table[1].super___shared_ptr<QColorTrcLut,_(__gnu_cxx::_Lock_policy)2>._M_ptr
        && (peVar12 ==
            (pQVar11->lut).table[2].super___shared_ptr<QColorTrcLut,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr)))) {
      if (0 < len) {
        pfVar29 = &buffer->z;
        lVar28 = 0;
        do {
          fVar31 = QColorTrcLut::u8ToLinearF32
                             ((((this->colorSpaceIn).d.ptr)->lut).table[0].
                              super___shared_ptr<QColorTrcLut,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                              (uint)src[lVar28]);
          pQVar11 = (this->colorSpaceIn).d.ptr;
          uVar1 = (pQVar11->whitePoint).x;
          uVar6 = (pQVar11->whitePoint).y;
          uVar2 = (pQVar11->whitePoint).z;
          uVar7 = (pQVar11->whitePoint).w;
          ((QColorVector *)(pfVar29 + -2))->x = (float)uVar1 * fVar31;
          pfVar29[-1] = (float)uVar6 * fVar31;
          *pfVar29 = (float)uVar2 * fVar31;
          pfVar29[1] = (float)uVar7 * fVar31;
          lVar28 = lVar28 + 1;
          pfVar29 = pfVar29 + 4;
        } while (len != lVar28);
      }
    }
    else if (0 < len) {
      pfVar29 = &buffer->z;
      lVar28 = 0;
      do {
        fVar31 = QColorTrcLut::u8ToLinearF32
                           ((((this->colorSpaceIn).d.ptr)->lut).table[0].
                            super___shared_ptr<QColorTrcLut,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                            (uint)src[lVar28]);
        fVar32 = QColorTrcLut::u8ToLinearF32
                           ((((this->colorSpaceIn).d.ptr)->lut).table[1].
                            super___shared_ptr<QColorTrcLut,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                            (uint)src[lVar28]);
        fVar33 = QColorTrcLut::u8ToLinearF32
                           ((((this->colorSpaceIn).d.ptr)->lut).table[2].
                            super___shared_ptr<QColorTrcLut,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                            (uint)src[lVar28]);
        pQVar11 = (this->colorSpaceIn).d.ptr;
        uVar3 = (pQVar11->toXyz).r.x;
        uVar8 = (pQVar11->toXyz).r.y;
        uVar4 = (pQVar11->toXyz).g.x;
        uVar9 = (pQVar11->toXyz).g.y;
        uVar5 = (pQVar11->toXyz).b.x;
        uVar10 = (pQVar11->toXyz).b.y;
        QVar35.y = fVar33 * (float)uVar10 + fVar31 * (float)uVar8 + (float)uVar9 * fVar32;
        QVar35.x = fVar33 * (float)uVar5 + fVar31 * (float)uVar3 + (float)uVar4 * fVar32;
        QVar35.z = fVar33 * (pQVar11->toXyz).b.z +
                   fVar31 * (pQVar11->toXyz).r.z + fVar32 * (pQVar11->toXyz).g.z;
        QVar35.w = 0.0;
        *(QColorVector *)(pfVar29 + -2) = QVar35;
        lVar28 = lVar28 + 1;
        pfVar29 = pfVar29 + 4;
      } while (len != lVar28);
    }
    bVar26 = QColorSpacePrivate::isThreeComponentMatrix((this->colorSpaceOut).d.ptr);
    pQVar11 = (this->colorSpaceIn).d.ptr;
    if ((((!bVar26) || (pQVar11->colorModel != Gray)) &&
        (bVar26 = QColorMatrix::isNull(&pQVar11->chad), auVar25 = ram0x0068f960, !bVar26)) &&
       (0 < len)) {
      pQVar11 = (this->colorSpaceIn).d.ptr;
      fVar31 = (pQVar11->chad).r.x;
      fVar32 = (pQVar11->chad).r.y;
      fVar33 = (pQVar11->chad).r.z;
      fVar13 = (pQVar11->chad).r.w;
      fVar14 = (pQVar11->chad).g.x;
      fVar15 = (pQVar11->chad).g.y;
      fVar16 = (pQVar11->chad).g.z;
      fVar17 = (pQVar11->chad).g.w;
      fVar18 = (pQVar11->chad).b.x;
      fVar19 = (pQVar11->chad).b.y;
      fVar20 = (pQVar11->chad).b.z;
      fVar21 = (pQVar11->chad).b.w;
      do {
        fVar22 = buffer->x;
        fVar23 = buffer->y;
        fVar24 = buffer->z;
        auVar34._0_4_ = fVar24 * fVar18 + fVar23 * fVar14 + fVar22 * fVar31;
        auVar34._4_4_ = fVar24 * fVar19 + fVar23 * fVar15 + fVar22 * fVar32;
        auVar34._8_4_ = fVar24 * fVar20 + fVar23 * fVar16 + fVar22 * fVar33;
        auVar34._12_4_ = fVar24 * fVar21 + fVar23 * fVar17 + fVar22 * fVar13;
        auVar34 = minps(auVar34,auVar25);
        QVar35 = (QColorVector)maxps(auVar34,ZEXT816(0));
        *buffer = QVar35;
        buffer = buffer + 1;
        len = len + -1;
      } while (len != 0);
    }
  }
  else {
    if (0 < len) {
      pfVar29 = &buffer->z;
      lVar28 = 0;
      do {
        fVar31 = (float)src[lVar28] * 0.003921569;
        ((QColorVector *)(pfVar29 + -2))->x = fVar31;
        pfVar29[-1] = fVar31;
        *pfVar29 = fVar31;
        lVar28 = lVar28 + 1;
        pfVar29 = pfVar29 + 4;
      } while (len != lVar28);
    }
    pQVar11 = (this->colorSpaceIn).d.ptr;
    lVar28 = (pQVar11->mAB).d.size;
    if (lVar28 != 0) {
      pvVar30 = (pQVar11->mAB).d.ptr;
      lVar28 = lVar28 * 0x1c8;
      do {
        lVar27 = (long)(char)*(__index_type *)
                              ((long)&(pvVar30->
                                      super__Variant_base<QColorSpacePrivate::TransferElement,_QColorMatrix,_QColorVector,_QColorCLUT>
                                      ).
                                      super__Move_assign_alias<QColorSpacePrivate::TransferElement,_QColorMatrix,_QColorVector,_QColorCLUT>
                                      .
                                      super__Copy_assign_alias<QColorSpacePrivate::TransferElement,_QColorMatrix,_QColorVector,_QColorCLUT>
                                      .
                                      super__Move_ctor_alias<QColorSpacePrivate::TransferElement,_QColorMatrix,_QColorVector,_QColorCLUT>
                                      .
                                      super__Copy_ctor_alias<QColorSpacePrivate::TransferElement,_QColorMatrix,_QColorVector,_QColorCLUT>
                                      .
                                      super__Variant_storage_alias<QColorSpacePrivate::TransferElement,_QColorMatrix,_QColorVector,_QColorCLUT>
                              + 0x1c0);
        local_50.buffer = &local_40;
        local_50.len = len;
        if (lVar27 == -1) {
          abort();
        }
        (*std::__detail::__variant::
          __gen_vtable<std::__detail::__variant::__deduce_visit_result<void>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/gui/painting/qcolortransform.cpp:1871:20)_&&,_const_std::variant<QColorSpacePrivate::TransferElement,_QColorMatrix,_QColorVector,_QColorCLUT>_&>
          ::_S_vtable._M_arr[lVar27]._M_data)(&local_50,pvVar30);
        pvVar30 = pvVar30 + 1;
        lVar28 = lVar28 + -0x1c8;
      } while (lVar28 != 0);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QColorTransformPrivate::applyConvertIn(const S *src, QColorVector *buffer, qsizetype len, TransformFlags flags) const
{
    if constexpr (IsGrayscale<S>) {
        if (colorSpaceIn->isThreeComponentMatrix()) {
            loadGray(buffer, src, len, this);
            if (!colorSpaceOut->isThreeComponentMatrix() || colorSpaceIn->colorModel != QColorSpace::ColorModel::Gray) {
                if (!colorSpaceIn->chad.isNull())
                    applyMatrix<DoClamp>(buffer, len, colorSpaceIn->chad);
            }
            return;
        }
    } else if constexpr (CanUseThreeComponent<S>) {
        if (colorSpaceIn->isThreeComponentMatrix()) {
            if (flags & InputPremultiplied)
                loadPremultiplied(buffer, src, len, this);
            else
                loadUnpremultiplied(buffer, src, len, this);

            if (!colorSpaceOut->isThreeComponentMatrix())
                applyMatrix<DoClamp>(buffer, len, colorMatrix);
            return;
        }
    }
    Q_ASSERT(!colorSpaceIn->isThreeComponentMatrix());

    if (flags & InputPremultiplied)
        loadPremultipliedLUT(buffer, src, len);
    else
        loadUnpremultipliedLUT(buffer, src, len);

    // Do element based conversion
    for (auto &&element : colorSpaceIn->mAB)
        std::visit([&buffer, len](auto &&elm) { visitElement(elm, buffer, len); }, element);
}